

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O1

void __thiscall
CGL::SceneObjects::DirectionalLight::DirectionalLight
          (DirectionalLight *this,Vector3D *rad,Vector3D *posLight,Vector3D *lightDir)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  (this->super_SceneLight)._vptr_SceneLight = (_func_int **)&PTR_sample_L_001199a0;
  (this->dirToLight).field_0.field_0.x = 0.0;
  (this->dirToLight).field_0.field_0.y = 0.0;
  (this->dirToLight).field_0.field_0.z = 0.0;
  (this->posLight).field_0.field_0.x = 0.0;
  (this->posLight).field_0.field_0.y = 0.0;
  (this->posLight).field_0.field_0.z = 0.0;
  (this->radiance).field_0.field_0.x = (rad->field_0).field_0.x;
  (this->radiance).field_0.field_0.y = (rad->field_0).field_0.y;
  (this->radiance).field_0.field_0.z = (rad->field_0).field_0.z;
  auVar5._0_8_ = -(posLight->field_0).field_0.z;
  auVar5._8_8_ = 0x8000000000000000;
  dVar3 = (posLight->field_0).field_0.y;
  (this->posLight).field_0.field_0.x = -(posLight->field_0).field_0.x;
  (this->posLight).field_0.field_0.y = -dVar3;
  dVar3 = (double)vmovlpd_avx(auVar5);
  (this->posLight).field_0.field_0.z = dVar3;
  auVar5 = *(undefined1 (*) [16])(lightDir->field_0).field_2.__vec;
  auVar5 = vdppd_avx(auVar5,auVar5,0x31);
  dVar3 = (lightDir->field_0).field_0.z;
  dVar3 = dVar3 * dVar3 + auVar5._0_8_;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar3;
    auVar5 = vsqrtsd_avx(auVar6,auVar6);
    dVar3 = auVar5._0_8_;
  }
  dVar4 = -(1.0 / dVar3);
  dVar1 = (lightDir->field_0).field_0.z;
  dVar2 = (lightDir->field_0).field_0.y;
  (this->dirToLight).field_0.field_0.x = dVar4 * (lightDir->field_0).field_0.x;
  (this->dirToLight).field_0.field_0.y = -(1.0 / dVar3) * dVar2;
  (this->dirToLight).field_0.field_0.z = dVar4 * dVar1;
  return;
}

Assistant:

DirectionalLight::DirectionalLight(const Vector3D rad,const Vector3D posLight,
                                   const Vector3D lightDir)
    : radiance(rad) {
  this->posLight = -posLight;
  dirToLight = -lightDir.unit();
}